

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Geometry *pGVar25;
  RTCFilterFunctionN p_Var26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  AABBNodeMB4D *node1;
  ulong uVar37;
  Scene *pSVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  NodeRef *pNVar43;
  ulong uVar44;
  size_t sVar45;
  ulong uVar46;
  bool bVar47;
  float fVar48;
  float fVar49;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar62;
  float fVar69;
  float fVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar72;
  float fVar76;
  float fVar77;
  undefined1 auVar73 [16];
  float fVar78;
  undefined1 auVar74 [16];
  float fVar79;
  undefined1 auVar75 [16];
  float fVar80;
  float fVar85;
  float fVar86;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar93;
  float fVar95;
  undefined1 auVar90 [16];
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  float fVar153;
  float fVar156;
  float fVar158;
  undefined1 auVar154 [16];
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar155 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  Scene *local_b20;
  undefined1 local_ab8 [16];
  undefined1 (*local_aa8) [16];
  Scene *local_aa0;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  pNVar43 = stack + 1;
  stack[0] = root;
  fVar19 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar20 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar21 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar114 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar126 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar136 = fVar114 * 0.99999964;
  fVar145 = fVar120 * 0.99999964;
  fVar131 = fVar126 * 0.99999964;
  fVar114 = fVar114 * 1.0000004;
  fVar120 = fVar120 * 1.0000004;
  fVar126 = fVar126 * 1.0000004;
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar22 = (tray->tnear).field_0.i[k];
  auVar154._4_4_ = iVar22;
  auVar154._0_4_ = iVar22;
  auVar154._8_4_ = iVar22;
  auVar154._12_4_ = iVar22;
  iVar22 = (tray->tfar).field_0.i[k];
  local_aa8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar47 = true;
  do {
    sVar45 = pNVar43[-1].ptr;
    pNVar43 = pNVar43 + -1;
    while ((sVar45 & 8) == 0) {
      uVar37 = sVar45 & 0xfffffffffffffff0;
      fVar79 = *(float *)(ray + k * 4 + 0x70);
      pfVar8 = (float *)(uVar37 + 0x80 + uVar44);
      pfVar1 = (float *)(uVar37 + 0x20 + uVar44);
      auVar63._0_4_ = ((*pfVar8 * fVar79 + *pfVar1) - fVar19) * fVar136;
      auVar63._4_4_ = ((pfVar8[1] * fVar79 + pfVar1[1]) - fVar19) * fVar136;
      auVar63._8_4_ = ((pfVar8[2] * fVar79 + pfVar1[2]) - fVar19) * fVar136;
      auVar63._12_4_ = ((pfVar8[3] * fVar79 + pfVar1[3]) - fVar19) * fVar136;
      auVar63 = maxps(auVar154,auVar63);
      pfVar8 = (float *)(uVar37 + 0x80 + uVar41);
      pfVar1 = (float *)(uVar37 + 0x20 + uVar41);
      auVar73._0_4_ = ((*pfVar8 * fVar79 + *pfVar1) - fVar20) * fVar145;
      auVar73._4_4_ = ((pfVar8[1] * fVar79 + pfVar1[1]) - fVar20) * fVar145;
      auVar73._8_4_ = ((pfVar8[2] * fVar79 + pfVar1[2]) - fVar20) * fVar145;
      auVar73._12_4_ = ((pfVar8[3] * fVar79 + pfVar1[3]) - fVar20) * fVar145;
      pfVar8 = (float *)(uVar37 + 0x80 + uVar46);
      pfVar1 = (float *)(uVar37 + 0x20 + uVar46);
      auVar81._0_4_ = ((*pfVar8 * fVar79 + *pfVar1) - fVar21) * fVar131;
      auVar81._4_4_ = ((pfVar8[1] * fVar79 + pfVar1[1]) - fVar21) * fVar131;
      auVar81._8_4_ = ((pfVar8[2] * fVar79 + pfVar1[2]) - fVar21) * fVar131;
      auVar81._12_4_ = ((pfVar8[3] * fVar79 + pfVar1[3]) - fVar21) * fVar131;
      auVar73 = maxps(auVar73,auVar81);
      auVar63 = maxps(auVar63,auVar73);
      pfVar8 = (float *)(uVar37 + 0x80 + (uVar44 ^ 0x10));
      pfVar1 = (float *)(uVar37 + 0x20 + (uVar44 ^ 0x10));
      auVar82._0_4_ = ((*pfVar8 * fVar79 + *pfVar1) - fVar19) * fVar114;
      auVar82._4_4_ = ((pfVar8[1] * fVar79 + pfVar1[1]) - fVar19) * fVar114;
      auVar82._8_4_ = ((pfVar8[2] * fVar79 + pfVar1[2]) - fVar19) * fVar114;
      auVar82._12_4_ = ((pfVar8[3] * fVar79 + pfVar1[3]) - fVar19) * fVar114;
      auVar84._4_4_ = iVar22;
      auVar84._0_4_ = iVar22;
      auVar84._8_4_ = iVar22;
      auVar84._12_4_ = iVar22;
      auVar73 = minps(auVar84,auVar82);
      pfVar8 = (float *)(uVar37 + 0x80 + (uVar41 ^ 0x10));
      pfVar1 = (float *)(uVar37 + 0x20 + (uVar41 ^ 0x10));
      auVar83._0_4_ = ((*pfVar8 * fVar79 + *pfVar1) - fVar20) * fVar120;
      auVar83._4_4_ = ((pfVar8[1] * fVar79 + pfVar1[1]) - fVar20) * fVar120;
      auVar83._8_4_ = ((pfVar8[2] * fVar79 + pfVar1[2]) - fVar20) * fVar120;
      auVar83._12_4_ = ((pfVar8[3] * fVar79 + pfVar1[3]) - fVar20) * fVar120;
      pfVar8 = (float *)(uVar37 + 0x80 + (uVar46 ^ 0x10));
      pfVar1 = (float *)(uVar37 + 0x20 + (uVar46 ^ 0x10));
      auVar90._0_4_ = ((*pfVar8 * fVar79 + *pfVar1) - fVar21) * fVar126;
      auVar90._4_4_ = ((pfVar8[1] * fVar79 + pfVar1[1]) - fVar21) * fVar126;
      auVar90._8_4_ = ((pfVar8[2] * fVar79 + pfVar1[2]) - fVar21) * fVar126;
      auVar90._12_4_ = ((pfVar8[3] * fVar79 + pfVar1[3]) - fVar21) * fVar126;
      auVar84 = minps(auVar83,auVar90);
      auVar73 = minps(auVar73,auVar84);
      bVar28 = auVar63._0_4_ <= auVar73._0_4_;
      bVar29 = auVar63._4_4_ <= auVar73._4_4_;
      bVar30 = auVar63._8_4_ <= auVar73._8_4_;
      bVar31 = auVar63._12_4_ <= auVar73._12_4_;
      if (((uint)sVar45 & 7) == 6) {
        bVar28 = (fVar79 < *(float *)(uVar37 + 0xf0) && *(float *)(uVar37 + 0xe0) <= fVar79) &&
                 bVar28;
        bVar29 = (fVar79 < *(float *)(uVar37 + 0xf4) && *(float *)(uVar37 + 0xe4) <= fVar79) &&
                 bVar29;
        bVar30 = (fVar79 < *(float *)(uVar37 + 0xf8) && *(float *)(uVar37 + 0xe8) <= fVar79) &&
                 bVar30;
        bVar31 = (fVar79 < *(float *)(uVar37 + 0xfc) && *(float *)(uVar37 + 0xec) <= fVar79) &&
                 bVar31;
      }
      auVar64._0_4_ = (uint)bVar28 * -0x80000000;
      auVar64._4_4_ = (uint)bVar29 * -0x80000000;
      auVar64._8_4_ = (uint)bVar30 * -0x80000000;
      auVar64._12_4_ = (uint)bVar31 * -0x80000000;
      uVar39 = movmskps((int)root.ptr,auVar64);
      root.ptr = (size_t)uVar39;
      if (uVar39 == 0) goto LAB_00260555;
      lVar40 = 0;
      if ((byte)uVar39 != 0) {
        for (; ((byte)uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
        }
      }
      sVar45 = *(size_t *)(uVar37 + lVar40 * 8);
      uVar39 = (uVar39 & 0xff) - 1 & uVar39 & 0xff;
      root.ptr = (size_t)uVar39;
      if (uVar39 != 0) {
        pNVar43->ptr = sVar45;
        pNVar43 = pNVar43 + 1;
        lVar40 = 0;
        if ((Scene *)root.ptr != (Scene *)0x0) {
          for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
          }
        }
        sVar45 = *(size_t *)(uVar37 + lVar40 * 8);
        uVar39 = uVar39 - 1 & uVar39;
        uVar42 = (ulong)uVar39;
        if (uVar39 != 0) {
          do {
            pNVar43->ptr = sVar45;
            pNVar43 = pNVar43 + 1;
            root.ptr = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> root.ptr & 1) == 0;
                  root.ptr = (long)&(((Scene *)root.ptr)->super_AccelN).super_Accel.super_AccelData.
                                    super_RefCount._vptr_RefCount + 1) {
              }
            }
            sVar45 = *(size_t *)(uVar37 + root.ptr * 8);
            uVar42 = uVar42 & uVar42 - 1;
          } while (uVar42 != 0);
        }
      }
    }
    pSVar38 = (Scene *)((ulong)((uint)sVar45 & 0xf) - 8);
    if (pSVar38 != (Scene *)0x0) {
      uVar37 = sVar45 & 0xfffffffffffffff0;
      local_b20 = (Scene *)0x0;
      local_aa0 = pSVar38;
      do {
        lVar40 = (long)local_b20 * 0x140;
        fVar79 = *(float *)(ray + k * 4 + 0x70);
        pfVar9 = (float *)(uVar37 + 0x90 + lVar40);
        pfVar7 = (float *)(uVar37 + lVar40);
        pfVar10 = (float *)(uVar37 + 0xa0 + lVar40);
        pfVar1 = (float *)(uVar37 + 0x10 + lVar40);
        pfVar11 = (float *)(uVar37 + 0xb0 + lVar40);
        pfVar8 = (float *)(uVar37 + 0x20 + lVar40);
        pfVar12 = (float *)(uVar37 + 0xc0 + lVar40);
        pfVar2 = (float *)(uVar37 + 0x30 + lVar40);
        pfVar13 = (float *)(uVar37 + 0xd0 + lVar40);
        pfVar3 = (float *)(uVar37 + 0x40 + lVar40);
        pfVar14 = (float *)(uVar37 + 0xe0 + lVar40);
        pfVar4 = (float *)(uVar37 + 0x50 + lVar40);
        pfVar15 = (float *)(uVar37 + 0xf0 + lVar40);
        pfVar5 = (float *)(uVar37 + 0x60 + lVar40);
        pfVar16 = (float *)(uVar37 + 0x100 + lVar40);
        pfVar6 = (float *)(uVar37 + 0x70 + lVar40);
        pfVar17 = (float *)(uVar37 + 0x110 + lVar40);
        pfVar18 = (float *)(uVar37 + 0x80 + lVar40);
        fVar87 = *(float *)(ray + k * 4);
        fVar151 = *(float *)(ray + k * 4 + 0x10);
        fVar71 = *(float *)(ray + k * 4 + 0x20);
        fVar72 = (*pfVar9 * fVar79 + *pfVar7) - fVar87;
        fVar76 = (pfVar9[1] * fVar79 + pfVar7[1]) - fVar87;
        fVar77 = (pfVar9[2] * fVar79 + pfVar7[2]) - fVar87;
        fVar78 = (pfVar9[3] * fVar79 + pfVar7[3]) - fVar87;
        fVar137 = (*pfVar10 * fVar79 + *pfVar1) - fVar151;
        fVar139 = (pfVar10[1] * fVar79 + pfVar1[1]) - fVar151;
        fVar141 = (pfVar10[2] * fVar79 + pfVar1[2]) - fVar151;
        fVar143 = (pfVar10[3] * fVar79 + pfVar1[3]) - fVar151;
        fVar152 = (*pfVar11 * fVar79 + *pfVar8) - fVar71;
        fVar156 = (pfVar11[1] * fVar79 + pfVar8[1]) - fVar71;
        fVar158 = (pfVar11[2] * fVar79 + pfVar8[2]) - fVar71;
        fVar160 = (pfVar11[3] * fVar79 + pfVar8[3]) - fVar71;
        fVar48 = (*pfVar12 * fVar79 + *pfVar2) - fVar87;
        fVar56 = (pfVar12[1] * fVar79 + pfVar2[1]) - fVar87;
        fVar58 = (pfVar12[2] * fVar79 + pfVar2[2]) - fVar87;
        fVar60 = (pfVar12[3] * fVar79 + pfVar2[3]) - fVar87;
        fVar99 = (*pfVar13 * fVar79 + *pfVar3) - fVar151;
        fVar101 = (pfVar13[1] * fVar79 + pfVar3[1]) - fVar151;
        fVar102 = (pfVar13[2] * fVar79 + pfVar3[2]) - fVar151;
        fVar103 = (pfVar13[3] * fVar79 + pfVar3[3]) - fVar151;
        fVar132 = (*pfVar14 * fVar79 + *pfVar4) - fVar71;
        fVar133 = (pfVar14[1] * fVar79 + pfVar4[1]) - fVar71;
        fVar134 = (pfVar14[2] * fVar79 + pfVar4[2]) - fVar71;
        fVar135 = (pfVar14[3] * fVar79 + pfVar4[3]) - fVar71;
        fVar80 = (*pfVar15 * fVar79 + *pfVar5) - fVar87;
        fVar85 = (pfVar15[1] * fVar79 + pfVar5[1]) - fVar87;
        fVar86 = (pfVar15[2] * fVar79 + pfVar5[2]) - fVar87;
        fVar87 = (pfVar15[3] * fVar79 + pfVar5[3]) - fVar87;
        fVar146 = (*pfVar16 * fVar79 + *pfVar6) - fVar151;
        fVar149 = (pfVar16[1] * fVar79 + pfVar6[1]) - fVar151;
        fVar150 = (pfVar16[2] * fVar79 + pfVar6[2]) - fVar151;
        fVar151 = (pfVar16[3] * fVar79 + pfVar6[3]) - fVar151;
        fVar62 = (fVar79 * *pfVar17 + *pfVar18) - fVar71;
        fVar69 = (fVar79 * pfVar17[1] + pfVar18[1]) - fVar71;
        fVar70 = (fVar79 * pfVar17[2] + pfVar18[2]) - fVar71;
        fVar71 = (fVar79 * pfVar17[3] + pfVar18[3]) - fVar71;
        fVar121 = fVar80 - fVar72;
        fVar123 = fVar85 - fVar76;
        fVar124 = fVar86 - fVar77;
        fVar125 = fVar87 - fVar78;
        fVar162 = fVar146 - fVar137;
        fVar163 = fVar149 - fVar139;
        fVar164 = fVar150 - fVar141;
        fVar165 = fVar151 - fVar143;
        fVar127 = fVar62 - fVar152;
        fVar128 = fVar69 - fVar156;
        fVar129 = fVar70 - fVar158;
        fVar130 = fVar71 - fVar160;
        fVar79 = *(float *)(ray + k * 4 + 0x50);
        fVar109 = *(float *)(ray + k * 4 + 0x60);
        fVar111 = *(float *)(ray + k * 4 + 0x40);
        fVar104 = (fVar162 * (fVar62 + fVar152) - (fVar146 + fVar137) * fVar127) * fVar111 +
                  ((fVar80 + fVar72) * fVar127 - (fVar62 + fVar152) * fVar121) * fVar79 +
                  (fVar121 * (fVar146 + fVar137) - (fVar80 + fVar72) * fVar162) * fVar109;
        fVar105 = (fVar163 * (fVar69 + fVar156) - (fVar149 + fVar139) * fVar128) * fVar111 +
                  ((fVar85 + fVar76) * fVar128 - (fVar69 + fVar156) * fVar123) * fVar79 +
                  (fVar123 * (fVar149 + fVar139) - (fVar85 + fVar76) * fVar163) * fVar109;
        fVar106 = (fVar164 * (fVar70 + fVar158) - (fVar150 + fVar141) * fVar129) * fVar111 +
                  ((fVar86 + fVar77) * fVar129 - (fVar70 + fVar158) * fVar124) * fVar79 +
                  (fVar124 * (fVar150 + fVar141) - (fVar86 + fVar77) * fVar164) * fVar109;
        fVar107 = (fVar165 * (fVar71 + fVar160) - (fVar151 + fVar143) * fVar130) * fVar111 +
                  ((fVar87 + fVar78) * fVar130 - (fVar71 + fVar160) * fVar125) * fVar79 +
                  (fVar125 * (fVar151 + fVar143) - (fVar87 + fVar78) * fVar165) * fVar109;
        fVar88 = fVar72 - fVar48;
        fVar93 = fVar76 - fVar56;
        fVar95 = fVar77 - fVar58;
        fVar97 = fVar78 - fVar60;
        fVar115 = fVar137 - fVar99;
        fVar117 = fVar139 - fVar101;
        fVar118 = fVar141 - fVar102;
        fVar119 = fVar143 - fVar103;
        fVar49 = fVar152 - fVar132;
        fVar57 = fVar156 - fVar133;
        fVar59 = fVar158 - fVar134;
        fVar61 = fVar160 - fVar135;
        fVar108 = (fVar115 * (fVar152 + fVar132) - (fVar137 + fVar99) * fVar49) * fVar111 +
                  ((fVar72 + fVar48) * fVar49 - (fVar152 + fVar132) * fVar88) * fVar79 +
                  (fVar88 * (fVar137 + fVar99) - (fVar72 + fVar48) * fVar115) * fVar109;
        fVar110 = (fVar117 * (fVar156 + fVar133) - (fVar139 + fVar101) * fVar57) * fVar111 +
                  ((fVar76 + fVar56) * fVar57 - (fVar156 + fVar133) * fVar93) * fVar79 +
                  (fVar93 * (fVar139 + fVar101) - (fVar76 + fVar56) * fVar117) * fVar109;
        fVar112 = (fVar118 * (fVar158 + fVar134) - (fVar141 + fVar102) * fVar59) * fVar111 +
                  ((fVar77 + fVar58) * fVar59 - (fVar158 + fVar134) * fVar95) * fVar79 +
                  (fVar95 * (fVar141 + fVar102) - (fVar77 + fVar58) * fVar118) * fVar109;
        fVar113 = (fVar119 * (fVar160 + fVar135) - (fVar143 + fVar103) * fVar61) * fVar111 +
                  ((fVar78 + fVar60) * fVar61 - (fVar160 + fVar135) * fVar97) * fVar79 +
                  (fVar97 * (fVar143 + fVar103) - (fVar78 + fVar60) * fVar119) * fVar109;
        fVar153 = fVar48 - fVar80;
        fVar157 = fVar56 - fVar85;
        fVar159 = fVar58 - fVar86;
        fVar161 = fVar60 - fVar87;
        fVar89 = fVar99 - fVar146;
        fVar94 = fVar101 - fVar149;
        fVar96 = fVar102 - fVar150;
        fVar98 = fVar103 - fVar151;
        fVar138 = fVar132 - fVar62;
        fVar140 = fVar133 - fVar69;
        fVar142 = fVar134 - fVar70;
        fVar144 = fVar135 - fVar71;
        auVar74._0_4_ =
             (fVar89 * (fVar62 + fVar132) - (fVar146 + fVar99) * fVar138) * fVar111 +
             ((fVar80 + fVar48) * fVar138 - (fVar62 + fVar132) * fVar153) * fVar79 +
             (fVar153 * (fVar146 + fVar99) - (fVar80 + fVar48) * fVar89) * fVar109;
        auVar74._4_4_ =
             (fVar94 * (fVar69 + fVar133) - (fVar149 + fVar101) * fVar140) * fVar111 +
             ((fVar85 + fVar56) * fVar140 - (fVar69 + fVar133) * fVar157) * fVar79 +
             (fVar157 * (fVar149 + fVar101) - (fVar85 + fVar56) * fVar94) * fVar109;
        auVar74._8_4_ =
             (fVar96 * (fVar70 + fVar134) - (fVar150 + fVar102) * fVar142) * fVar111 +
             ((fVar86 + fVar58) * fVar142 - (fVar70 + fVar134) * fVar159) * fVar79 +
             (fVar159 * (fVar150 + fVar102) - (fVar86 + fVar58) * fVar96) * fVar109;
        auVar74._12_4_ =
             (fVar98 * (fVar71 + fVar135) - (fVar151 + fVar103) * fVar144) * fVar111 +
             ((fVar87 + fVar60) * fVar144 - (fVar71 + fVar135) * fVar161) * fVar79 +
             (fVar161 * (fVar151 + fVar103) - (fVar87 + fVar60) * fVar98) * fVar109;
        fVar56 = fVar104 + fVar108 + auVar74._0_4_;
        fVar58 = fVar105 + fVar110 + auVar74._4_4_;
        fVar60 = fVar106 + fVar112 + auVar74._8_4_;
        fVar62 = fVar107 + fVar113 + auVar74._12_4_;
        auVar50._4_4_ = fVar105;
        auVar50._0_4_ = fVar104;
        auVar50._8_4_ = fVar106;
        auVar50._12_4_ = fVar107;
        auVar33._4_4_ = fVar110;
        auVar33._0_4_ = fVar108;
        auVar33._8_4_ = fVar112;
        auVar33._12_4_ = fVar113;
        auVar63 = minps(auVar50,auVar33);
        auVar63 = minps(auVar63,auVar74);
        auVar147._4_4_ = fVar105;
        auVar147._0_4_ = fVar104;
        auVar147._8_4_ = fVar106;
        auVar147._12_4_ = fVar107;
        auVar34._4_4_ = fVar110;
        auVar34._0_4_ = fVar108;
        auVar34._8_4_ = fVar112;
        auVar34._12_4_ = fVar113;
        auVar73 = maxps(auVar147,auVar34);
        auVar73 = maxps(auVar73,auVar74);
        fVar87 = ABS(fVar56) * 1.1920929e-07;
        fVar151 = ABS(fVar58) * 1.1920929e-07;
        fVar71 = ABS(fVar60) * 1.1920929e-07;
        fVar48 = ABS(fVar62) * 1.1920929e-07;
        auVar148._4_4_ = -(uint)(auVar73._4_4_ <= fVar151);
        auVar148._0_4_ = -(uint)(auVar73._0_4_ <= fVar87);
        auVar148._8_4_ = -(uint)(auVar73._8_4_ <= fVar71);
        auVar148._12_4_ = -(uint)(auVar73._12_4_ <= fVar48);
        auVar51._4_4_ = -(uint)(-fVar151 <= auVar63._4_4_);
        auVar51._0_4_ = -(uint)(-fVar87 <= auVar63._0_4_);
        auVar51._8_4_ = -(uint)(-fVar71 <= auVar63._8_4_);
        auVar51._12_4_ = -(uint)(-fVar48 <= auVar63._12_4_);
        auVar148 = auVar148 | auVar51;
        uVar39 = movmskps((int)pSVar38,auVar148);
        pSVar38 = (Scene *)(ulong)uVar39;
        if (uVar39 != 0) {
          auVar116._0_4_ = fVar115 * fVar138 - fVar89 * fVar49;
          auVar116._4_4_ = fVar117 * fVar140 - fVar94 * fVar57;
          auVar116._8_4_ = fVar118 * fVar142 - fVar96 * fVar59;
          auVar116._12_4_ = fVar119 * fVar144 - fVar98 * fVar61;
          auVar52._4_4_ = -(uint)(ABS(fVar117 * fVar128) < ABS(fVar94 * fVar57));
          auVar52._0_4_ = -(uint)(ABS(fVar115 * fVar127) < ABS(fVar89 * fVar49));
          auVar52._8_4_ = -(uint)(ABS(fVar118 * fVar129) < ABS(fVar96 * fVar59));
          auVar52._12_4_ = -(uint)(ABS(fVar119 * fVar130) < ABS(fVar98 * fVar61));
          auVar32._4_4_ = fVar163 * fVar57 - fVar117 * fVar128;
          auVar32._0_4_ = fVar162 * fVar49 - fVar115 * fVar127;
          auVar32._8_4_ = fVar164 * fVar59 - fVar118 * fVar129;
          auVar32._12_4_ = fVar165 * fVar61 - fVar119 * fVar130;
          local_898 = blendvps(auVar116,auVar32,auVar52);
          auVar155._0_4_ = fVar153 * fVar49 - fVar88 * fVar138;
          auVar155._4_4_ = fVar157 * fVar57 - fVar93 * fVar140;
          auVar155._8_4_ = fVar159 * fVar59 - fVar95 * fVar142;
          auVar155._12_4_ = fVar161 * fVar61 - fVar97 * fVar144;
          auVar53._4_4_ = -(uint)(ABS(fVar123 * fVar57) < ABS(fVar93 * fVar140));
          auVar53._0_4_ = -(uint)(ABS(fVar121 * fVar49) < ABS(fVar88 * fVar138));
          auVar53._8_4_ = -(uint)(ABS(fVar124 * fVar59) < ABS(fVar95 * fVar142));
          auVar53._12_4_ = -(uint)(ABS(fVar125 * fVar61) < ABS(fVar97 * fVar144));
          auVar35._4_4_ = fVar128 * fVar93 - fVar123 * fVar57;
          auVar35._0_4_ = fVar127 * fVar88 - fVar121 * fVar49;
          auVar35._8_4_ = fVar129 * fVar95 - fVar124 * fVar59;
          auVar35._12_4_ = fVar130 * fVar97 - fVar125 * fVar61;
          local_888 = blendvps(auVar155,auVar35,auVar53);
          auVar91._0_4_ = fVar121 * fVar115 - fVar88 * fVar162;
          auVar91._4_4_ = fVar123 * fVar117 - fVar93 * fVar163;
          auVar91._8_4_ = fVar124 * fVar118 - fVar95 * fVar164;
          auVar91._12_4_ = fVar125 * fVar119 - fVar97 * fVar165;
          auVar122._0_4_ = fVar88 * fVar89 - fVar153 * fVar115;
          auVar122._4_4_ = fVar93 * fVar94 - fVar157 * fVar117;
          auVar122._8_4_ = fVar95 * fVar96 - fVar159 * fVar118;
          auVar122._12_4_ = fVar97 * fVar98 - fVar161 * fVar119;
          auVar54._4_4_ = -(uint)(ABS(fVar93 * fVar163) < ABS(fVar157 * fVar117));
          auVar54._0_4_ = -(uint)(ABS(fVar88 * fVar162) < ABS(fVar153 * fVar115));
          auVar54._8_4_ = -(uint)(ABS(fVar95 * fVar164) < ABS(fVar159 * fVar118));
          auVar54._12_4_ = -(uint)(ABS(fVar97 * fVar165) < ABS(fVar161 * fVar119));
          local_878 = blendvps(auVar122,auVar91,auVar54);
          fVar87 = fVar111 * local_898._0_4_ + fVar79 * local_888._0_4_ + fVar109 * local_878._0_4_;
          fVar151 = fVar111 * local_898._4_4_ + fVar79 * local_888._4_4_ + fVar109 * local_878._4_4_
          ;
          fVar71 = fVar111 * local_898._8_4_ + fVar79 * local_888._8_4_ + fVar109 * local_878._8_4_;
          fVar79 = fVar111 * local_898._12_4_ +
                   fVar79 * local_888._12_4_ + fVar109 * local_878._12_4_;
          auVar75._0_4_ = fVar87 + fVar87;
          auVar75._4_4_ = fVar151 + fVar151;
          auVar75._8_4_ = fVar71 + fVar71;
          auVar75._12_4_ = fVar79 + fVar79;
          auVar65._0_4_ = fVar152 * local_878._0_4_;
          auVar65._4_4_ = fVar156 * local_878._4_4_;
          auVar65._8_4_ = fVar158 * local_878._8_4_;
          auVar65._12_4_ = fVar160 * local_878._12_4_;
          fVar109 = fVar72 * local_898._0_4_ + fVar137 * local_888._0_4_ + auVar65._0_4_;
          fVar111 = fVar76 * local_898._4_4_ + fVar139 * local_888._4_4_ + auVar65._4_4_;
          fVar48 = fVar77 * local_898._8_4_ + fVar141 * local_888._8_4_ + auVar65._8_4_;
          fVar49 = fVar78 * local_898._12_4_ + fVar143 * local_888._12_4_ + auVar65._12_4_;
          auVar63 = rcpps(auVar65,auVar75);
          fVar79 = auVar63._0_4_;
          fVar87 = auVar63._4_4_;
          fVar151 = auVar63._8_4_;
          fVar71 = auVar63._12_4_;
          local_8a8._0_4_ = ((1.0 - auVar75._0_4_ * fVar79) * fVar79 + fVar79) * (fVar109 + fVar109)
          ;
          local_8a8._4_4_ = ((1.0 - auVar75._4_4_ * fVar87) * fVar87 + fVar87) * (fVar111 + fVar111)
          ;
          local_8a8._8_4_ =
               ((1.0 - auVar75._8_4_ * fVar151) * fVar151 + fVar151) * (fVar48 + fVar48);
          local_8a8._12_4_ = ((1.0 - auVar75._12_4_ * fVar71) * fVar71 + fVar71) * (fVar49 + fVar49)
          ;
          fVar79 = *(float *)(ray + k * 4 + 0x80);
          fVar87 = *(float *)(ray + k * 4 + 0x30);
          auVar66._0_4_ =
               -(uint)(local_8a8._0_4_ <= fVar79 && fVar87 <= local_8a8._0_4_) & auVar148._0_4_;
          auVar66._4_4_ =
               -(uint)(local_8a8._4_4_ <= fVar79 && fVar87 <= local_8a8._4_4_) & auVar148._4_4_;
          auVar66._8_4_ =
               -(uint)(local_8a8._8_4_ <= fVar79 && fVar87 <= local_8a8._8_4_) & auVar148._8_4_;
          auVar66._12_4_ =
               -(uint)(local_8a8._12_4_ <= fVar79 && fVar87 <= local_8a8._12_4_) & auVar148._12_4_;
          uVar39 = movmskps(uVar39,auVar66);
          pSVar38 = (Scene *)(ulong)uVar39;
          if (uVar39 != 0) {
            auVar67._0_4_ = auVar66._0_4_ & -(uint)(auVar75._0_4_ != 0.0);
            auVar67._4_4_ = auVar66._4_4_ & -(uint)(auVar75._4_4_ != 0.0);
            auVar67._8_4_ = auVar66._8_4_ & -(uint)(auVar75._8_4_ != 0.0);
            auVar67._12_4_ = auVar66._12_4_ & -(uint)(auVar75._12_4_ != 0.0);
            uVar39 = movmskps(uVar39,auVar67);
            pSVar38 = (Scene *)(ulong)uVar39;
            if (uVar39 != 0) {
              auVar36._4_4_ = fVar58;
              auVar36._0_4_ = fVar56;
              auVar36._8_4_ = fVar60;
              auVar36._12_4_ = fVar62;
              pSVar38 = context->scene;
              auVar63 = rcpps(local_8a8,auVar36);
              fVar87 = auVar63._0_4_;
              fVar151 = auVar63._4_4_;
              fVar71 = auVar63._8_4_;
              fVar109 = auVar63._12_4_;
              fVar87 = (float)(-(uint)(1e-18 <= ABS(fVar56)) &
                              (uint)(((float)DAT_01f7ba10 - fVar56 * fVar87) * fVar87 + fVar87));
              fVar151 = (float)(-(uint)(1e-18 <= ABS(fVar58)) &
                               (uint)((DAT_01f7ba10._4_4_ - fVar58 * fVar151) * fVar151 + fVar151));
              fVar71 = (float)(-(uint)(1e-18 <= ABS(fVar60)) &
                              (uint)((DAT_01f7ba10._8_4_ - fVar60 * fVar71) * fVar71 + fVar71));
              fVar109 = (float)(-(uint)(1e-18 <= ABS(fVar62)) &
                               (uint)((DAT_01f7ba10._12_4_ - fVar62 * fVar109) * fVar109 + fVar109))
              ;
              auVar92._0_4_ = fVar104 * fVar87;
              auVar92._4_4_ = fVar105 * fVar151;
              auVar92._8_4_ = fVar106 * fVar71;
              auVar92._12_4_ = fVar107 * fVar109;
              local_8c8 = minps(auVar92,_DAT_01f7ba10);
              auVar100._0_4_ = fVar87 * fVar108;
              auVar100._4_4_ = fVar151 * fVar110;
              auVar100._8_4_ = fVar71 * fVar112;
              auVar100._12_4_ = fVar109 * fVar113;
              local_8b8 = minps(auVar100,_DAT_01f7ba10);
              uVar42 = (ulong)(byte)uVar39;
              do {
                uVar27 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                local_808 = *(uint *)(lVar40 + uVar37 + 0x120 + uVar27 * 4);
                pGVar25 = (pSVar38->geometries).items[local_808].ptr;
                if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0026056b:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar47;
                  }
                  local_838 = *(undefined4 *)(local_8c8 + uVar27 * 4);
                  uVar23 = *(undefined4 *)(local_8b8 + uVar27 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar27 * 4);
                  args.context = context->user;
                  uVar24 = *(undefined4 *)(lVar40 + uVar37 + 0x130 + uVar27 * 4);
                  local_818._4_4_ = uVar24;
                  local_818._0_4_ = uVar24;
                  local_818._8_4_ = uVar24;
                  local_818._12_4_ = uVar24;
                  local_828._4_4_ = uVar23;
                  local_828._0_4_ = uVar23;
                  local_828._8_4_ = uVar23;
                  local_828._12_4_ = uVar23;
                  uVar23 = *(undefined4 *)(local_898 + uVar27 * 4);
                  uVar24 = *(undefined4 *)(local_888 + uVar27 * 4);
                  local_848 = *(undefined4 *)(local_878 + uVar27 * 4);
                  local_858._4_4_ = uVar24;
                  local_858._0_4_ = uVar24;
                  local_858._8_4_ = uVar24;
                  local_858._12_4_ = uVar24;
                  local_868[0] = (RTCHitN)(char)uVar23;
                  local_868[1] = (RTCHitN)(char)((uint)uVar23 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar23;
                  local_868[5] = (RTCHitN)(char)((uint)uVar23 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar23;
                  local_868[9] = (RTCHitN)(char)((uint)uVar23 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar23;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar23 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar23 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar23 >> 0x18);
                  uStack_844 = local_848;
                  uStack_840 = local_848;
                  uStack_83c = local_848;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_ab8 = *local_aa8;
                  args.valid = (int *)local_ab8;
                  args.geometryUserPtr = pGVar25->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar25->occlusionFilterN)(&args);
                  }
                  if (local_ab8 == (undefined1  [16])0x0) {
                    auVar68._8_4_ = 0xffffffff;
                    auVar68._0_8_ = 0xffffffffffffffff;
                    auVar68._12_4_ = 0xffffffff;
                    auVar68 = auVar68 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var26 = context->args->filter;
                    if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var26)(&args);
                    }
                    auVar55._0_4_ = -(uint)(local_ab8._0_4_ == 0);
                    auVar55._4_4_ = -(uint)(local_ab8._4_4_ == 0);
                    auVar55._8_4_ = -(uint)(local_ab8._8_4_ == 0);
                    auVar55._12_4_ = -(uint)(local_ab8._12_4_ == 0);
                    auVar68 = auVar55 ^ _DAT_01f7ae20;
                    auVar63 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar55
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar63;
                  }
                  if ((_DAT_01f7bb20 & auVar68) != (undefined1  [16])0x0) goto LAB_0026056b;
                  *(float *)(ray + k * 4 + 0x80) = fVar79;
                }
                uVar42 = uVar42 ^ 1L << (uVar27 & 0x3f);
              } while (uVar42 != 0);
            }
          }
        }
        root.ptr = (long)&(local_b20->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                          _vptr_RefCount + 1;
        local_b20 = (Scene *)root.ptr;
      } while ((Scene *)root.ptr != local_aa0);
    }
LAB_00260555:
    bVar47 = pNVar43 != stack;
    if (!bVar47) {
      return bVar47;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }